

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

void cmSHA1_Internal_Transform(SHA_CTX *context,sha_word32 *data)

{
  cm_sha2_uint32_t cVar1;
  uint uVar2;
  cm_sha2_uint32_t cVar3;
  cm_sha2_uint32_t cVar4;
  cm_sha2_uint32_t cVar5;
  cm_sha2_uint32_t cVar6;
  cm_sha2_uint32_t cVar7;
  uint uVar8;
  ulong uVar9;
  cm_sha2_uint32_t cVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  cm_sha2_uint32_t cVar17;
  uint uVar18;
  uint uVar19;
  
  cVar1 = (context->s1).state[0];
  uVar2 = (context->s1).state[1];
  cVar3 = (context->s1).state[2];
  cVar4 = (context->s1).state[3];
  cVar5 = (context->s1).state[4];
  lVar13 = 0;
  cVar6 = cVar4;
  cVar7 = cVar5;
  uVar11 = uVar2;
  cVar10 = cVar3;
  cVar17 = cVar1;
  do {
    uVar8 = cVar17;
    uVar18 = cVar10;
    uVar12 = cVar6;
    uVar14 = data[lVar13];
    uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    *(uint *)((long)context + lVar13 * 4 + 0x20) = uVar14;
    cVar10 = uVar11 << 0x1e | uVar11 >> 2;
    cVar17 = ((uVar18 ^ uVar12) & uVar11 ^ uVar12) + (uVar8 << 5 | uVar8 >> 0x1b) + cVar7 + uVar14 +
             0x5a827999;
    lVar13 = lVar13 + 1;
    cVar6 = uVar18;
    cVar7 = uVar12;
    uVar11 = uVar8;
  } while (lVar13 != 0x10);
  uVar9 = 0;
  do {
    uVar19 = cVar17;
    uVar11 = cVar10;
    uVar14 = uVar18;
    uVar18 = *(uint *)((long)context + (uVar9 ^ 8) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)((int)uVar9 + 0x1dU & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + uVar9 * 4 + 0x28) ^
             *(uint *)((long)context + uVar9 * 4 + 0x20);
    uVar18 = uVar18 << 1 | (uint)((int)uVar18 < 0);
    *(uint *)((long)context + uVar9 * 4 + 0x20) = uVar18;
    cVar10 = uVar8 << 0x1e | uVar8 >> 2;
    cVar17 = uVar18 + ((uVar11 ^ uVar14) & uVar8 ^ uVar14) + (uVar19 << 5 | uVar19 >> 0x1b) + uVar12
             + 0x5a827999;
    uVar9 = uVar9 + 1;
    uVar18 = uVar11;
    uVar12 = uVar14;
    uVar8 = uVar19;
  } while (uVar9 != 4);
  uVar18 = 0x14;
  do {
    uVar16 = cVar17;
    uVar12 = cVar10;
    uVar8 = uVar11;
    uVar15 = uVar18 & 0xf;
    uVar11 = *(uint *)((long)context + (ulong)(uVar15 ^ 8) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar18 + 0xd & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar18 + 2 & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)uVar15 * 4 + 0x20);
    uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
    *(uint *)((long)context + (ulong)uVar15 * 4 + 0x20) = uVar11;
    cVar10 = uVar19 << 0x1e | uVar19 >> 2;
    cVar17 = uVar11 + (uVar12 ^ uVar19 ^ uVar8) + uVar14 + (uVar16 << 5 | uVar16 >> 0x1b) +
             0x6ed9eba1;
    uVar18 = uVar18 + 1;
    uVar11 = uVar12;
    uVar14 = uVar8;
    uVar19 = uVar16;
  } while (uVar18 != 0x28);
  uVar11 = 0x28;
  do {
    uVar19 = cVar17;
    uVar14 = cVar10;
    uVar18 = uVar12;
    uVar15 = uVar11 & 0xf;
    uVar12 = *(uint *)((long)context + (ulong)(uVar15 ^ 8) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar11 + 0xd & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar11 + 2 & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)uVar15 * 4 + 0x20);
    uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    *(uint *)((long)context + (ulong)uVar15 * 4 + 0x20) = uVar12;
    cVar10 = uVar16 << 0x1e | uVar16 >> 2;
    cVar17 = uVar12 + (uVar18 & uVar14 ^ (uVar18 ^ uVar14) & uVar16) +
                      (uVar19 << 5 | uVar19 >> 0x1b) + uVar8 + 0x8f1bbcdc;
    uVar11 = uVar11 + 1;
    uVar12 = uVar14;
    uVar8 = uVar18;
    uVar16 = uVar19;
  } while (uVar11 != 0x3c);
  uVar11 = 0x3c;
  do {
    uVar15 = cVar17;
    uVar8 = cVar10;
    uVar12 = uVar14;
    uVar16 = uVar11 & 0xf;
    uVar14 = *(uint *)((long)context + (ulong)(uVar16 ^ 8) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar11 + 0xd & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)(uVar11 + 2 & 0xf) * 4 + 0x20) ^
             *(uint *)((long)context + (ulong)uVar16 * 4 + 0x20);
    uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    *(uint *)((long)context + (ulong)uVar16 * 4 + 0x20) = uVar14;
    cVar10 = uVar19 << 0x1e | uVar19 >> 2;
    cVar17 = uVar14 + (uVar8 ^ uVar19 ^ uVar12) + uVar18 + (uVar15 << 5 | uVar15 >> 0x1b) +
             0xca62c1d6;
    uVar11 = uVar11 + 1;
    uVar14 = uVar8;
    uVar18 = uVar12;
    uVar19 = uVar15;
  } while (uVar11 != 0x50);
  (context->s1).state[0] = cVar17 + cVar1;
  (context->s1).state[1] = uVar15 + uVar2;
  (context->s1).state[2] = cVar10 + cVar3;
  (context->s1).state[3] = uVar8 + cVar4;
  (context->s1).state[4] = uVar12 + cVar5;
  return;
}

Assistant:

void SHA1_Internal_Transform(SHA_CTX* context, const sha_word32* data) {
	sha_word32	a, b, c, d, e;
	sha_word32	T1, *W1;
	int		j;

	W1 = (sha_word32*)context->s1.buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->s1.state[0];
	b = context->s1.state[1];
	c = context->s1.state[2];
	d = context->s1.state[3];
	e = context->s1.state[4];
	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		T1 = data[j];
		/* Copy data while converting to host byte order */
		REVERSE32(*data++, W1[j]);
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + W1[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + (W1[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 16);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Ch(b,c,d) + e + K1_0_TO_19 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 20);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_20_TO_39 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 40);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Maj(b,c,d) + e + K1_40_TO_59 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 60);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_60_TO_79 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 80);


	/* Compute the current intermediate hash value */
	context->s1.state[0] += a;
	context->s1.state[1] += b;
	context->s1.state[2] += c;
	context->s1.state[3] += d;
	context->s1.state[4] += e;

	/* Clean up */
	a = b = c = d = e = T1 = 0;
}